

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_GetCVar(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  FString activator;
  float fVar1;
  FString *other;
  char *cvarname_00;
  FBaseCVar *pFVar2;
  bool bVar3;
  bool local_6b;
  FBaseCVar *cvar;
  FString cvarname;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numret < 1) {
    param_local._4_4_ = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x28a,
                    "int AF_AActor_GetCVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (numparam < 1) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x28b,
                    "int AF_AActor_GetCVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    bVar3 = false;
    if (((param->field_0).field_3.Type == '\x03') &&
       (bVar3 = true, (param->field_0).field_1.atag != 1)) {
      bVar3 = (param->field_0).field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x28b,
                    "int AF_AActor_GetCVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    cvarname.Chars = *(char **)&param->field_0;
    local_6b = true;
    if ((DObject *)cvarname.Chars != (DObject *)0x0) {
      local_6b = DObject::IsKindOf((DObject *)cvarname.Chars,AActor::RegistrationInfo.MyClass);
    }
    if (local_6b == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x28b,
                    "int AF_AActor_GetCVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (numparam < 2) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x28c,
                    "int AF_AActor_GetCVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (param[1].field_0.field_3.Type != '\x02') {
      __assert_fail("param[paramnum].Type == REGT_STRING",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x28c,
                    "int AF_AActor_GetCVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    other = VMValue::s(param + 1);
    FString::FString((FString *)&cvar,other);
    activator = cvarname;
    cvarname_00 = FString::operator_cast_to_char_((FString *)&cvar);
    pFVar2 = GetCVar((AActor *)activator.Chars,cvarname_00);
    if (pFVar2 == (FBaseCVar *)0x0) {
      VMReturn::SetFloat(ret,0.0);
    }
    else {
      fVar1 = (float)(*pFVar2->_vptr_FBaseCVar[4])(pFVar2,2);
      VMReturn::SetFloat(ret,(double)fVar1);
    }
    param_local._4_4_ = 1;
    FString::~FString((FString *)&cvar);
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GetCVar)
{
	if (numret > 0)
	{
		assert(ret != nullptr);
		PARAM_SELF_PROLOGUE(AActor);
		PARAM_STRING(cvarname);

		FBaseCVar *cvar = GetCVar(self, cvarname);
		if (cvar == nullptr)
		{
			ret->SetFloat(0);
		}
		else
		{
			ret->SetFloat(cvar->GetGenericRep(CVAR_Float).Float);
		}
		return 1;
	}
	return 0;
}